

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

void google::protobuf::internal::WireFormat::SerializeMessageSetItemWithCachedSizes
               (FieldDescriptor *field,Message *message,CodedOutputStream *output)

{
  int iVar1;
  uint32 uVar2;
  undefined4 extraout_var;
  long *plVar3;
  Message *sub_message;
  Reflection *message_reflection;
  CodedOutputStream *output_local;
  Message *message_local;
  FieldDescriptor *field_local;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  io::CodedOutputStream::WriteVarint32(output,0xb);
  io::CodedOutputStream::WriteVarint32(output,0x10);
  uVar2 = FieldDescriptor::number(field);
  io::CodedOutputStream::WriteVarint32(output,uVar2);
  io::CodedOutputStream::WriteVarint32(output,0x1a);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xd8))
                             ((long *)CONCAT44(extraout_var,iVar1),message,field,0);
  uVar2 = (**(code **)(*plVar3 + 0x78))();
  io::CodedOutputStream::WriteVarint32(output,uVar2);
  (**(code **)(*plVar3 + 0x68))(plVar3,output);
  io::CodedOutputStream::WriteVarint32(output,0xc);
  return;
}

Assistant:

void WireFormat::SerializeMessageSetItemWithCachedSizes(
    const FieldDescriptor* field,
    const Message& message,
    io::CodedOutputStream* output) {
  const Reflection* message_reflection = message.GetReflection();

  // Start group.
  output->WriteVarint32(WireFormatLite::kMessageSetItemStartTag);

  // Write type ID.
  output->WriteVarint32(WireFormatLite::kMessageSetTypeIdTag);
  output->WriteVarint32(field->number());

  // Write message.
  output->WriteVarint32(WireFormatLite::kMessageSetMessageTag);

  const Message& sub_message = message_reflection->GetMessage(message, field);
  output->WriteVarint32(sub_message.GetCachedSize());
  sub_message.SerializeWithCachedSizes(output);

  // End group.
  output->WriteVarint32(WireFormatLite::kMessageSetItemEndTag);
}